

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChEnumMapper<myEnum>::AddMapping
          (ChEnumMapper<myEnum> *this,char *autoname,myEnum enumid,char *custom_name)

{
  ChEnumNamePair<myEnum> mpair;
  ChEnumNamePair<myEnum> CStack_38;
  
  if (custom_name != (char *)0x0) {
    autoname = custom_name;
  }
  ChEnumNamePair<myEnum>::ChEnumNamePair(&CStack_38,autoname,enumid);
  std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>::
  push_back((this->enummap).
            super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr,&CStack_38);
  std::__cxx11::string::~string((string *)&CStack_38);
  return;
}

Assistant:

void AddMapping(const char* autoname, Te enumid, const char* custom_name) {
        const char* name = autoname;
        if (custom_name)
            name = custom_name;
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }